

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O2

bool __thiscall
pybind11::detail::
type_caster<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_void>
::load(type_caster<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_void>
       *this,handle src,bool convert)

{
  PointerType dataPtr;
  bool bVar1;
  bool bVar2;
  pointer __p;
  pointer __p_00;
  EigenIndex cols;
  Array aref;
  Index local_70;
  Index local_68;
  EigenConformable<true> local_60;
  
  bVar2 = array_t<double,_17>::check_(src);
  if (bVar2) {
    bVar2 = true;
    aref.super_array.super_buffer.super_object.super_handle.m_ptr = (array)(array)src.m_ptr;
    if (src.m_ptr == (PyObject *)0x0) {
      cols = 0;
      local_68 = 0;
      local_70 = 0;
LAB_00224aa6:
      bVar1 = true;
    }
    else {
      (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
      EigenProps<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>_>
      ::conformable(&local_60,&aref.super_array);
      cols = local_60.cols;
      local_70 = local_60.rows;
      local_68 = local_60.stride.m_outer.m_value;
      if ((local_60.conformable & 1U) == 0) {
        bVar2 = false;
      }
      else {
        if (((local_60.negativestrides & 1U) != 0) ||
           (local_60.cols != 1 && local_60.stride.m_inner.m_value != 1)) goto LAB_00224aa6;
        pybind11::object::operator=((object *)&this->copy_or_ref,(object *)&aref);
      }
      bVar1 = false;
    }
    pybind11::object::~object((object *)&aref);
    if (!bVar2) {
      return false;
    }
    if (!bVar1) goto LAB_00224b5d;
  }
  if (convert) {
    array_t<double,_17>::ensure(&aref,src);
    if ((((aref.super_array.super_buffer.super_object.super_handle.m_ptr != (buffer)0x0) &&
         (EigenProps<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>_>
          ::conformable(&local_60,&aref.super_array), (local_60.conformable & 1U) != 0)) &&
        ((local_60.negativestrides & 1U) == 0)) &&
       (local_60.cols == 1 || local_60.stride.m_inner.m_value == 1)) {
      local_70 = local_60.rows;
      local_68 = local_60.stride.m_outer.m_value;
      pybind11::object::operator=((object *)&this->copy_or_ref,(object *)&aref);
      loader_life_support::add_patient
                ((this->copy_or_ref).super_array.super_buffer.super_object.super_handle.m_ptr);
      pybind11::object::~object((object *)&aref);
      cols = local_60.cols;
LAB_00224b5d:
      std::
      __uniq_ptr_impl<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_std::default_delete<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>_>_>
      ::reset((__uniq_ptr_impl<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_std::default_delete<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>_>
               *)&this->ref,(pointer)0x0);
      __p = (pointer)operator_new(0x28);
      dataPtr = (PointerType)
                (this->copy_or_ref).super_array.super_buffer.super_object.super_handle.m_ptr[1].
                ob_refcnt;
      Eigen::OuterStride<-1>::OuterStride((OuterStride<_1> *)&local_60,local_68);
      Eigen::
      MapBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_0>
      ::MapBase((MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
                 *)__p,dataPtr,local_70,cols);
      (__p->m_stride).super_Stride<_1,_0>.m_outer.m_value =
           CONCAT71(local_60._1_7_,local_60.conformable);
      std::
      __uniq_ptr_impl<Eigen::Map<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_std::default_delete<Eigen::Map<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>_>_>
      ::reset((__uniq_ptr_impl<Eigen::Map<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_std::default_delete<Eigen::Map<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>_>
               *)this,__p);
      __p_00 = (pointer)operator_new(0x38);
      Eigen::Ref<Eigen::Matrix<double,-1,3,1,-1,3>const,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Map<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>>
                ((Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>> *)__p_00,
                 (DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
                  *)(this->map)._M_t.
                    super___uniq_ptr_impl<Eigen::Map<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_std::default_delete<Eigen::Map<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Eigen::Map<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_*,_std::default_delete<Eigen::Map<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>_>
                    .
                    super__Head_base<0UL,_Eigen::Map<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_*,_false>
                    ._M_head_impl,(type *)0x0);
      std::
      __uniq_ptr_impl<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_std::default_delete<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>_>_>
      ::reset((__uniq_ptr_impl<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_std::default_delete<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>_>
               *)&this->ref,__p_00);
      return true;
    }
    pybind11::object::~object((object *)&aref);
  }
  return false;
}

Assistant:

bool load(handle src, bool convert) {
        // First check whether what we have is already an array of the right type.  If not, we can't
        // avoid a copy (because the copy is also going to do type conversion).
        bool need_copy = !isinstance<Array>(src);

        EigenConformable<props::row_major> fits;
        if (!need_copy) {
            // We don't need a converting copy, but we also need to check whether the strides are
            // compatible with the Ref's stride requirements
            Array aref = reinterpret_borrow<Array>(src);

            if (aref && (!need_writeable || aref.writeable())) {
                fits = props::conformable(aref);
                if (!fits) return false; // Incompatible dimensions
                if (!fits.template stride_compatible<props>())
                    need_copy = true;
                else
                    copy_or_ref = std::move(aref);
            }
            else {
                need_copy = true;
            }
        }

        if (need_copy) {
            // We need to copy: If we need a mutable reference, or we're not supposed to convert
            // (either because we're in the no-convert overload pass, or because we're explicitly
            // instructed not to copy (via `py::arg().noconvert()`) we have to fail loading.
            if (!convert || need_writeable) return false;

            Array copy = Array::ensure(src);
            if (!copy) return false;
            fits = props::conformable(copy);
            if (!fits || !fits.template stride_compatible<props>())
                return false;
            copy_or_ref = std::move(copy);
            loader_life_support::add_patient(copy_or_ref);
        }

        ref.reset();
        map.reset(new MapType(data(copy_or_ref), fits.rows, fits.cols, make_stride(fits.stride.outer(), fits.stride.inner())));
        ref.reset(new Type(*map));

        return true;
    }